

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

int exported_names_cmp(void *p1,void *p2,void *opaque)

{
  int iVar1;
  int iVar2;
  JSValueUnion ctx;
  JSValueUnion p1_00;
  JSValue v;
  JSValue v_00;
  
  v = __JS_AtomToValue((JSContext *)opaque,*p1,1);
  ctx = v.u;
  v_00 = __JS_AtomToValue((JSContext *)opaque,*p2,1);
  p1_00 = v_00.u;
  iVar2 = 0;
  if ((uint)v_00.tag != 6 && (uint)v.tag != 6) {
    iVar2 = js_string_compare((JSContext *)ctx.ptr,(JSString *)p1_00.ptr,(JSString *)v_00.tag);
  }
  if ((0xfffffff4 < (uint)v.tag) && (iVar1 = *ctx.ptr, *(int *)ctx.ptr = iVar1 + -1, iVar1 < 2)) {
    __JS_FreeValueRT(*(JSRuntime **)((long)opaque + 0x18),v);
  }
  if ((0xfffffff4 < (uint)v_00.tag) &&
     (iVar1 = *p1_00.ptr, *(int *)p1_00.ptr = iVar1 + -1, iVar1 < 2)) {
    __JS_FreeValueRT(*(JSRuntime **)((long)opaque + 0x18),v_00);
  }
  return iVar2;
}

Assistant:

static int exported_names_cmp(const void *p1, const void *p2, void *opaque)
{
    JSContext *ctx = opaque;
    const ExportedNameEntry *me1 = p1;
    const ExportedNameEntry *me2 = p2;
    JSValue str1, str2;
    int ret;

    /* XXX: should avoid allocation memory in atom comparison */
    str1 = JS_AtomToString(ctx, me1->export_name);
    str2 = JS_AtomToString(ctx, me2->export_name);
    if (JS_IsException(str1) || JS_IsException(str2)) {
        /* XXX: raise an error ? */
        ret = 0;
    } else {
        ret = js_string_compare(ctx, JS_VALUE_GET_STRING(str1),
                                JS_VALUE_GET_STRING(str2));
    }
    JS_FreeValue(ctx, str1);
    JS_FreeValue(ctx, str2);
    return ret;
}